

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O1

bool __thiscall
helics::InputInfo::addData
          (InputInfo *this,GlobalHandle source_id,Time valueTime,uint iteration,
          shared_ptr<const_helics::SmallBuffer> *data)

{
  pointer pGVar1;
  pointer pvVar2;
  long lVar3;
  dataRecord *pdVar4;
  ulong uVar5;
  bool bVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  SmallBuffer *sb1;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  const_iterator __position;
  long lVar10;
  uint local_44;
  TimeRepresentation<count_time<9,_long>_> local_40;
  value_type local_38;
  
  local_38.data.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (data->super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (local_38.data.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (SmallBuffer *)0x0) {
    pGVar1 = (this->input_sources).
             super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar8 = (uint)((ulong)((long)(this->input_sources).
                                 super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar1) >> 3);
    if (0 < (int)uVar8) {
      lVar9 = 0;
      lVar10 = 0;
      do {
        if ((*(int *)((long)&(pGVar1->fed_id).gid + lVar9) == source_id.fed_id.gid.gid) &&
           (*(int *)((long)&(pGVar1->handle).hid + lVar9) == source_id.handle.hid.hid)) {
          if (*(long *)((long)&((this->deactivated).
                                super__Vector_base<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->internalTimeCode + lVar9
                       ) < valueTime.internalTimeCode) {
            return false;
          }
          pvVar2 = (this->data_queues).
                   super__Vector_base<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar3 = *(long *)((long)&(pvVar2->
                                   super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                                   )._M_impl.super__Vector_impl_data + lVar10 + 8);
          local_44 = iteration;
          local_40.internalTimeCode = valueTime.internalTimeCode;
          if (*(long *)((long)&(pvVar2->
                               super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                               )._M_impl.super__Vector_impl_data + lVar10) == lVar3) {
            sb1 = *(SmallBuffer **)
                   ((long)&(((this->current_data).
                             super__Vector_base<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr + lVar9 * 2);
            if (sb1 == (SmallBuffer *)0x0) goto LAB_002e05b1;
            lVar3 = (this->minTimeGap).internalTimeCode;
            if ((0 < lVar3) &&
               (valueTime.internalTimeCode -
                *(long *)((long)&(((this->current_data_time).
                                   super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->first).
                                 internalTimeCode + lVar9 * 2) < lVar3)) {
              return false;
            }
            if (this->only_update_on_change != true) goto LAB_002e05b1;
          }
          else {
            if (valueTime.internalTimeCode <= *(long *)(lVar3 + -0x20)) {
              local_38.data.
              super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (data->
                      super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount._M_pi;
              (data->super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr = (element_type *)0x0;
              (data->super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              pvVar2 = (this->data_queues).
                       super__Vector_base<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pdVar4 = *(dataRecord **)
                        ((long)&(pvVar2->
                                super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                                )._M_impl.super__Vector_impl_data + lVar10);
              __position._M_current = pdVar4;
              uVar7 = *(long *)((long)&(pvVar2->
                                       super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                                       )._M_impl.super__Vector_impl_data + lVar10 + 8) -
                      (long)pdVar4 >> 5;
              while (uVar5 = uVar7, 0 < (long)uVar5) {
                uVar7 = uVar5 >> 1;
                lVar9 = __position._M_current[uVar7].time.internalTimeCode;
                if ((lVar9 <= valueTime.internalTimeCode) &&
                   ((valueTime.internalTimeCode != lVar9 ||
                    (__position._M_current[uVar7].iteration <= iteration)))) {
                  __position._M_current = __position._M_current + uVar7 + 1;
                  uVar7 = ~uVar7 + uVar5;
                }
              }
              local_38.time.internalTimeCode = valueTime.internalTimeCode;
              local_38.iteration = iteration;
              if ((__position._M_current != pdVar4) &&
                 (((lVar9 = (this->minTimeGap).internalTimeCode, 0 < lVar9 &&
                   (valueTime.internalTimeCode - __position._M_current[-1].time.internalTimeCode <
                    lVar9)) ||
                  ((this->only_update_on_change == true &&
                   (bVar6 = operator==(__position._M_current[-1].data.
                                       super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,local_38.data.
                                               super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr), bVar6)))))) {
                if (local_38.data.
                    super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  return false;
                }
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_38.data.
                           super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
                return false;
              }
              std::
              vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
              ::_M_insert_rval((vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                                *)((long)&(((this->data_queues).
                                            super__Vector_base<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                                          )._M_impl.super__Vector_impl_data + lVar10),__position,
                               &local_38);
              if (local_38.data.
                  super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_38.data.
                           super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              return true;
            }
            lVar9 = (this->minTimeGap).internalTimeCode;
            if ((0 < lVar9) && (valueTime.internalTimeCode - *(long *)(lVar3 + -0x20) < lVar9)) {
              return false;
            }
            if (this->only_update_on_change != true) goto LAB_002e05b1;
            sb1 = *(SmallBuffer **)(lVar3 + -0x10);
          }
          bVar6 = operator==(sb1,local_38.data.
                                 super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
          if (bVar6) {
            return false;
          }
LAB_002e05b1:
          std::vector<helics::InputInfo::dataRecord,std::allocator<helics::InputInfo::dataRecord>>::
          emplace_back<TimeRepresentation<count_time<9,long>>&,unsigned_int&,std::shared_ptr<helics::SmallBuffer_const>>
                    ((vector<helics::InputInfo::dataRecord,std::allocator<helics::InputInfo::dataRecord>>
                      *)((long)&(((this->data_queues).
                                  super__Vector_base<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                                )._M_impl.super__Vector_impl_data + lVar10),&local_40,&local_44,data
                    );
          return true;
        }
        lVar10 = lVar10 + 0x18;
        lVar9 = lVar9 + 8;
      } while ((ulong)(uVar8 & 0x7fffffff) * 0x18 != lVar10);
    }
  }
  return false;
}

Assistant:

bool InputInfo::addData(GlobalHandle source_id,
                        Time valueTime,
                        unsigned int iteration,
                        std::shared_ptr<const SmallBuffer> data)
{
    if (!data) {
        return false;
    }
    int index;
    bool found = false;
    for (index = 0; index < static_cast<int>(input_sources.size()); ++index) {
        if (input_sources[index] == source_id) {
            if (valueTime > deactivated[index]) {
                return false;
            }
            found = true;
            break;
        }
    }
    if (!found) {
        return false;
    }
    if (data_queues[index].empty()) {
        if (current_data[index]) {
            if (minTimeGap > timeZero) {
                if ((valueTime - current_data_time[index].first) < minTimeGap) {
                    return false;
                }
            }
            if (only_update_on_change) {
                if (*current_data[index] == *data) {
                    return false;
                }
            }
        }
        data_queues[index].emplace_back(valueTime, iteration, std::move(data));
    } else if (valueTime > data_queues[index].back().time) {
        if (minTimeGap > timeZero) {
            if ((valueTime - data_queues[index].back().time) < minTimeGap) {
                return false;
            }
        }
        if (only_update_on_change) {
            if (*data_queues[index].back().data == *data) {
                return false;
            }
        }
        data_queues[index].emplace_back(valueTime, iteration, std::move(data));
    } else {
        dataRecord newRecord(valueTime, iteration, std::move(data));
        auto m = std::upper_bound(data_queues[index].begin(),
                                  data_queues[index].end(),
                                  newRecord,
                                  recordComparison);
        if (m != data_queues[index].begin()) {
            auto prev = m;
            --prev;
            if (minTimeGap > timeZero) {
                if ((valueTime - prev->time) < minTimeGap) {
                    return false;
                }
            }
            if (only_update_on_change) {
                if (*prev->data == *newRecord.data) {
                    return false;
                }
            }
        }
        data_queues[index].insert(m, std::move(newRecord));
    }
    return true;
}